

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R3_binary_search_tree.c
# Opt level: O0

int main(void)

{
  int local_1c;
  NODE *pNStack_18;
  int i;
  NODE *root;
  
  root._4_4_ = 0;
  pNStack_18 = (NODE *)0x0;
  for (local_1c = 0; local_1c < 10; local_1c = local_1c + 1) {
    insert(&stack0xffffffffffffffe8,local_1c);
  }
  inorder(pNStack_18);
  printf("\n");
  delete(&stack0xffffffffffffffe8,3);
  inorder(pNStack_18);
  printf("\n");
  return 0;
}

Assistant:

int main() {
  NODE *root = NULL;
  for (int i = 0; i < 10; i++) {
    insert(&root, i);
  }
  inorder(root);
  printf("\n");

  delete (&root, 3);
  inorder(root);
  printf("\n");

  return 0;
}